

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelinePostFS::Cleanup(AdvancedPipelinePostFS *this)

{
  int width;
  int height;
  int local_14;
  int i;
  AdvancedPipelinePostFS *this_local;
  
  width = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
  height = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,0,width,height);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[local_14]);
  }
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,2,this->m_render_target);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_framebuffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glUseProgram(0);
		for (int i = 0; i < 3; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteTextures(2, m_render_target);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteFramebuffers(1, &m_framebuffer);
		return NO_ERROR;
	}